

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

shared_ptr<Variable> __thiscall Builder::getvarbyname(Builder *this,string *name)

{
  iterator iVar1;
  Variable *this_00;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Variable> sVar3;
  string sStack_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>
  local_58;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00 = (Variable *)operator_new(0x38);
    std::__cxx11::string::string((string *)&sStack_78,(string *)in_RDX);
    Variable::Variable(this_00,&sStack_78);
    std::__shared_ptr<Variable,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Variable,void>
              ((__shared_ptr<Variable,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__cxx11::string::~string((string *)&sStack_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>
    ::pair<std::shared_ptr<Variable>_&,_true>(&local_58,in_RDX,(shared_ptr<Variable> *)this);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<Variable>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Variable>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)name,&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>
    ::~pair(&local_58);
    std::vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>::push_back
              ((vector<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_> *)
               &name[3]._M_string_length,(value_type *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Variable>_>,_true>
                      ._M_cur + 0x28));
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Variable>)sVar3.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Variable> getvarbyname(const std::string& name) {
    auto it = variables.find(name);
    if (it != variables.end()) return it->second;
    auto newvar = std::shared_ptr<Variable>(new Variable(name));
    variables.insert(std::make_pair(name, newvar));
    model.variables.push_back(newvar);
    return newvar;
  }